

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DeepTiledInputFile::readPixelSampleCounts
          (DeepTiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  int iVar1;
  int iVar2;
  pthread_mutex_t *__mutex;
  IStream *pIVar3;
  Compressor *pCVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  DeepTiledInputFile *pDVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined4 extraout_var;
  Int64 *pIVar13;
  Data *pDVar14;
  stringstream *psVar15;
  stringstream *psVar16;
  char *pcVar17;
  InputExc *pIVar18;
  ostream *poVar19;
  ArgExc *pAVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined8 uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  undefined4 in_register_0000008c;
  ulong uVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  bool bVar33;
  char local_229;
  char *readPtr;
  DeepTiledInputFile *local_220;
  undefined8 local_218;
  ulong local_210;
  ulong local_208;
  undefined8 local_200;
  Box2i tileRange;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  local_218 = CONCAT44(in_register_0000008c,lx);
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar10 = pthread_mutex_lock(__mutex);
  local_220 = this;
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  iVar10 = (*this->_data->_streamData->is->_vptr_IStream[5])();
  local_200 = CONCAT44(extraout_var,iVar10);
  if ((((int)(ly | (uint)local_218) < 0) ||
      (((pDVar14 = local_220->_data, (uint)local_218 != ly &&
        ((pDVar14->tileDesc).mode == MIPMAP_LEVELS)) ||
       (pDVar14->numXLevels <= (int)(uint)local_218)))) || (pDVar14->numYLevels <= ly)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Level coordinate (",0x12);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_218);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,") is invalid.",0xd);
    pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar20,&_iex_throw_s);
    __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  uVar11 = dx2;
  if (dx1 < dx2) {
    uVar11 = dx1;
  }
  uVar12 = dy2;
  if (dy2 < dy1) {
    uVar12 = dy1;
  }
  if (dy1 < dy2) {
    dy2 = dy1;
  }
  uVar21 = uVar12 + 1;
  uVar26 = dy2 - 1;
  bVar33 = pDVar14->lineOrder != DECREASING_Y;
  if (!bVar33) {
    dy2 = uVar12;
    uVar21 = uVar26;
  }
  if (dy2 != uVar21) {
    uVar25 = local_218;
    if (dx2 < dx1) {
      dx2 = dx1;
    }
    do {
      local_210 = (ulong)(uint)dy2;
      uVar12 = uVar11;
      do {
        iVar31 = (int)local_210;
        iVar10 = (int)uVar25;
        bVar9 = isValidTile(local_220,uVar12,iVar31,iVar10,ly);
        if (!bVar9) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Tile (",6);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,(int)local_210);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,iVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,",",1);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,") is not a valid tile.",0x16);
          pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar20,&_iex_throw_s);
          __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        Imf_2_5::dataWindowForTile
                  ((Imf_2_5 *)&tileRange,&pDVar14->tileDesc,pDVar14->minX,pDVar14->maxX,
                   pDVar14->minY,pDVar14->maxY,uVar12,iVar31,iVar10,ly);
        pDVar14 = local_220->_data;
        iVar1 = pDVar14->sampleCountXTileCoords;
        lVar30 = (long)tileRange.min.x;
        iVar2 = pDVar14->sampleCountYTileCoords;
        lVar24 = (long)tileRange.min.y;
        pIVar3 = pDVar14->_streamData->is;
        local_208 = (ulong)uVar12;
        pIVar13 = TileOffsets::operator()(&pDVar14->tileOffsets,uVar12,iVar31,iVar10,ly);
        (*pIVar3->_vptr_IStream[6])(pIVar3,*pIVar13);
        pDVar14 = local_220->_data;
        if ((pDVar14->version & 0x1000) != 0) {
          pIVar3 = pDVar14->_streamData->is;
          (*pIVar3->_vptr_IStream[3])(pIVar3,&readPtr,4);
          pDVar14 = local_220->_data;
          if ((int)readPtr != pDVar14->partNumber) {
            pIVar18 = (InputExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::InputExc::InputExc(pIVar18,"Unexpected part number.");
            __cxa_throw(pIVar18,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
          }
        }
        pDVar8 = local_220;
        pIVar3 = pDVar14->_streamData->is;
        (*pIVar3->_vptr_IStream[3])(pIVar3,&readPtr,4);
        iVar10 = (int)readPtr;
        pIVar3 = pDVar8->_data->_streamData->is;
        (*pIVar3->_vptr_IStream[3])(pIVar3,&readPtr,4);
        iVar31 = (int)readPtr;
        pIVar3 = pDVar8->_data->_streamData->is;
        (*pIVar3->_vptr_IStream[3])(pIVar3,&readPtr,4);
        iVar5 = (int)readPtr;
        pIVar3 = pDVar8->_data->_streamData->is;
        (*pIVar3->_vptr_IStream[3])(pIVar3,&readPtr,4);
        pDVar8 = local_220;
        if (iVar10 != (int)local_208) {
          pcVar17 = "Unexpected tile x coordinate.";
LAB_004730ec:
          pIVar18 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(pIVar18,pcVar17);
          __cxa_throw(pIVar18,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        if (iVar31 != (int)local_210) {
          pcVar17 = "Unexpected tile y coordinate.";
          goto LAB_004730ec;
        }
        if (iVar5 != (uint)local_218) {
          pcVar17 = "Unexpected tile x level number coordinate.";
          goto LAB_004730ec;
        }
        if ((int)readPtr != ly) {
          pcVar17 = "Unexpected tile y level number coordinate.";
          goto LAB_004730ec;
        }
        pIVar3 = local_220->_data->_streamData->is;
        (*pIVar3->_vptr_IStream[3])(pIVar3,&readPtr,8);
        pcVar17 = readPtr;
        pIVar3 = pDVar8->_data->_streamData->is;
        (*pIVar3->_vptr_IStream[3])(pIVar3,&readPtr,8);
        pcVar6 = readPtr;
        pIVar3 = pDVar8->_data->_streamData->is;
        (*pIVar3->_vptr_IStream[3])(pIVar3,&readPtr,8);
        pcVar7 = readPtr;
        pDVar14 = pDVar8->_data;
        if ((char *)pDVar14->maxSampleCountTableSize < pcVar17) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"Bad sampleCountTableDataSize read from tile ",0x2c);
          uVar25 = local_218;
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_208);
          readPtr = (char *)CONCAT71(readPtr._1_7_,0x2c);
          poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&readPtr,1);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,(int)local_210);
          readPtr = (char *)CONCAT71(readPtr._1_7_,0x2c);
          poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&readPtr,1);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,(int)uVar25);
          readPtr = (char *)CONCAT71(readPtr._1_7_,0x2c);
          poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&readPtr,1);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,": expected ",0xb);
          poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19," or less, got ",0xe);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
          pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar20,&_iex_throw_s);
          __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        if ((((char *)0x7fffffff < pcVar6) || ((char *)0x7fffffff < readPtr)) ||
           ((ulong)pcVar17 >> 0x1f != 0)) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"This version of the library does not",0x24);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"support the allocation of data with size  > ",0x2c);
          poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19," file table size    :",0x15);
          poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19," file unpacked size :",0x15);
          poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19," file packed size   :",0x15);
          poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,".\n",2);
          pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar20,&_iex_throw_s);
          __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        pIVar3 = pDVar14->_streamData->is;
        (*pIVar3->_vptr_IStream[3])
                  (pIVar3,(pDVar14->sampleCountTableBuffer)._data,(ulong)pcVar17 & 0xffffffff);
        uVar25 = local_218;
        pDVar14 = local_220->_data;
        iVar10 = (int)local_218;
        if (pcVar17 < (char *)pDVar14->maxSampleCountTableSize) {
          pCVar4 = pDVar14->sampleCountTableComp;
          if (pCVar4 == (Compressor *)0x0) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,"Deep scanline data corrupt at tile ",0x23);
            poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_208);
            local_229 = ',';
            poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,&local_229,1);
            poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,(int)local_210);
            local_229 = ',';
            poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,&local_229,1);
            poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,iVar10);
            local_229 = ',';
            poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,&local_229,1);
            poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar19," (sampleCountTableDataSize error)",0x21);
            pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar20,&_iex_throw_s);
            __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
          }
          (*pCVar4->_vptr_Compressor[6])
                    (pCVar4,(pDVar14->sampleCountTableBuffer)._data,(ulong)pcVar17 & 0xffffffff,
                     (ulong)(uint)tileRange.min.y,&readPtr);
        }
        else {
          readPtr = (pDVar14->sampleCountTableBuffer)._data;
        }
        if (tileRange.max.y < tileRange.min.y) {
          lVar32 = 0;
        }
        else {
          uVar28 = (ulong)(uint)tileRange.max.x;
          lVar32 = 0;
          psVar16 = (stringstream *)readPtr;
          lVar22 = (long)tileRange.min.y;
          do {
            if ((int)uVar28 < tileRange.min.x) {
              uVar29 = 0;
            }
            else {
              pDVar14 = local_220->_data;
              lVar23 = (long)tileRange.min.x;
              uVar12 = 0;
              do {
                lVar27 = 0;
                psVar15 = psVar16;
                do {
                  psVar16 = psVar15 + 1;
                  (&_iex_throw_s)[lVar27] = *psVar15;
                  lVar27 = lVar27 + 1;
                  psVar15 = psVar16;
                } while ((int)lVar27 != 4);
                uVar29 = (ulong)__iex_throw_s;
                readPtr = (char *)psVar16;
                if ((int)__iex_throw_s < (int)uVar12) {
                  iex_debugTrap();
                  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,"Deep tile sampleCount data corrupt at tile ",0x2b);
                  poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_208)
                  ;
                  local_229 = ',';
                  poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,&local_229,1)
                  ;
                  poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,(int)local_210);
                  local_229 = ',';
                  poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,&local_229,1)
                  ;
                  poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,iVar10);
                  local_229 = ',';
                  poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,&local_229,1)
                  ;
                  poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19," (negative sample count detected)",0x21);
                  pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
                  Iex_2_5::ArgExc::ArgExc(pAVar20,&_iex_throw_s);
                  __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
                }
                *(uint *)(pDVar14->sampleCountSliceBase +
                         (long)(int)pDVar14->sampleCountXStride * (lVar23 - lVar30 * iVar1) +
                         (long)(int)pDVar14->sampleCountYStride * (lVar22 - lVar24 * iVar2)) =
                     __iex_throw_s - uVar12;
                uVar28 = (ulong)tileRange.max.x;
                bVar9 = lVar23 < (long)uVar28;
                lVar23 = lVar23 + 1;
                uVar12 = __iex_throw_s;
              } while (bVar9);
            }
            lVar32 = lVar32 + uVar29;
            bVar9 = lVar22 < tileRange.max.y;
            lVar22 = lVar22 + 1;
          } while (bVar9);
        }
        pDVar14 = local_220->_data;
        pcVar17 = (char *)(pDVar14->combinedSampleSize * lVar32);
        if (pcVar7 <= pcVar17 && (long)pcVar17 - (long)pcVar7 != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"Deep scanline sampleCount data corrupt at tile ",0x2f);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_208);
          local_229 = ',';
          poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,&local_229,1);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,(int)local_210);
          local_229 = ',';
          poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,&local_229,1);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,iVar10);
          local_229 = ',';
          poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,&local_229,1);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar19,": pixel data only contains ",0x1b);
          poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar19," bytes of data but table references at least ",0x2d);
          poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19," bytes of sample data",0x15);
          pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar20,&_iex_throw_s);
          __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        uVar12 = (int)local_208 + 1;
      } while ((int)local_208 != dx2);
      dy2 = (int)local_210 + (uint)bVar33 * 2 + -1;
    } while (dy2 != uVar21);
  }
  pIVar3 = pDVar14->_streamData->is;
  (*pIVar3->_vptr_IStream[6])(pIVar3,local_200);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepTiledInputFile::readPixelSampleCounts (int dx1, int dx2,
                                           int dy1, int dy2,
                                           int lx,  int ly)
{
    Int64 savedFilePos = 0;

    try
    {
        Lock lock (*_data->_streamData);

        savedFilePos = _data->_streamData->is->tellg();

        
        if (!isValidLevel (lx, ly))
        {
            THROW (IEX_NAMESPACE::ArgExc,
                   "Level coordinate "
                   "(" << lx << ", " << ly << ") "
                   "is invalid.");
        }
        
        if (dx1 > dx2)
            std::swap (dx1, dx2);

        if (dy1 > dy2)
            std::swap (dy1, dy2);

        int dyStart = dy1;
        int dyStop  = dy2 + 1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dyStop  = dy1 - 1;
            dY      = -1;
        }

        // (TODO) Check if we have read the sample counts for those tiles,
        // if we have, no need to read again.
        for (int dy = dyStart; dy != dyStop; dy += dY)
        {
            for (int dx = dx1; dx <= dx2; dx++)
            {
                
                if (!isValidTile (dx, dy, lx, ly))
                {
                    THROW (IEX_NAMESPACE::ArgExc,
                           "Tile (" << dx << ", " << dy << ", " <<
                           lx << "," << ly << ") is not a valid tile.");
                }
                
                Box2i tileRange = OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
                        _data->tileDesc,
                        _data->minX, _data->maxX,
                        _data->minY, _data->maxY,
                        dx, dy, lx, ly);

                int xOffset = _data->sampleCountXTileCoords * tileRange.min.x;
                int yOffset = _data->sampleCountYTileCoords * tileRange.min.y;

                //
                // Skip and check the tile coordinates.
                //

                _data->_streamData->is->seekg(_data->tileOffsets(dx, dy, lx, ly));

                if (isMultiPart(_data->version))
                {
                    int partNumber;
                    Xdr::read <StreamIO> (*_data->_streamData->is, partNumber);

                    if (partNumber != _data->partNumber)
                        throw IEX_NAMESPACE::InputExc ("Unexpected part number.");
                }

                int xInFile, yInFile, lxInFile, lyInFile;
                Xdr::read <StreamIO> (*_data->_streamData->is, xInFile);
                Xdr::read <StreamIO> (*_data->_streamData->is, yInFile);
                Xdr::read <StreamIO> (*_data->_streamData->is, lxInFile);
                Xdr::read <StreamIO> (*_data->_streamData->is, lyInFile);

                if (xInFile != dx)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile x coordinate.");

                if (yInFile != dy)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile y coordinate.");

                if (lxInFile != lx)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile x level number coordinate.");

                if (lyInFile != ly)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile y level number coordinate.");

                Int64 tableSize, dataSize, unpackedDataSize;
                Xdr::read <StreamIO> (*_data->_streamData->is, tableSize);
                Xdr::read <StreamIO> (*_data->_streamData->is, dataSize);
                Xdr::read <StreamIO> (*_data->_streamData->is, unpackedDataSize);

                
                if(tableSize>_data->maxSampleCountTableSize)
                {
                    THROW (IEX_NAMESPACE::ArgExc, "Bad sampleCountTableDataSize read from tile "<< dx << ',' << dy << ',' << lx << ',' << ly << ": expected " << _data->maxSampleCountTableSize << " or less, got "<< tableSize);
                }
                    
                
                //
                // We make a check on the data size requirements here.
                // Whilst we wish to store 64bit sizes on disk, not all the compressors
                // have been made to work with such data sizes and are still limited to
                // using signed 32 bit (int) for the data size. As such, this version
                // insists that we validate that the data size does not exceed the data
                // type max limit.
                // @TODO refactor the compressor code to ensure full 64-bit support.
                //

                Int64 compressorMaxDataSize = static_cast<Int64>(std::numeric_limits<int>::max());
                if (dataSize         > compressorMaxDataSize ||
                    unpackedDataSize > compressorMaxDataSize ||
                    tableSize        > compressorMaxDataSize)
                {
                    THROW (IEX_NAMESPACE::ArgExc, "This version of the library does not"
                          << "support the allocation of data with size  > "
                          << compressorMaxDataSize
                          << " file table size    :" << tableSize
                          << " file unpacked size :" << unpackedDataSize
                          << " file packed size   :" << dataSize << ".\n");
                }

                //
                // Read and uncompress the pixel sample count table.
                //

                _data->_streamData->is->read(_data->sampleCountTableBuffer, tableSize);

                const char* readPtr;

                if (tableSize < _data->maxSampleCountTableSize)
                {
                    if(!_data->sampleCountTableComp)
                    {
                        THROW(IEX_NAMESPACE::ArgExc,"Deep scanline data corrupt at tile " << dx << ',' << dy << ',' << lx << ',' <<  ly << " (sampleCountTableDataSize error)");
                    }
                    _data->sampleCountTableComp->uncompress(_data->sampleCountTableBuffer,
                                                            tableSize,
                                                            tileRange.min.y,
                                                            readPtr);
                }
                else
                    readPtr = _data->sampleCountTableBuffer;

                size_t cumulative_total_samples =0;
                int lastAccumulatedCount;
                for (int j = tileRange.min.y; j <= tileRange.max.y; j++)
                {
                    lastAccumulatedCount = 0;
                    for (int i = tileRange.min.x; i <= tileRange.max.x; i++)
                    {
                        int accumulatedCount;
                        Xdr::read <CharPtrIO> (readPtr, accumulatedCount);
                        
                        if (accumulatedCount < lastAccumulatedCount)
                        {
                            THROW(IEX_NAMESPACE::ArgExc,"Deep tile sampleCount data corrupt at tile " 
                                  << dx << ',' << dy << ',' << lx << ',' <<  ly << " (negative sample count detected)");
                        }

                        int count = accumulatedCount - lastAccumulatedCount;
                        lastAccumulatedCount = accumulatedCount;
                        
                        _data->getSampleCount(i - xOffset, j - yOffset) =count;
                    }
                    cumulative_total_samples += lastAccumulatedCount;
                }
                
                if(cumulative_total_samples * _data->combinedSampleSize > unpackedDataSize)
                {
                    THROW(IEX_NAMESPACE::ArgExc,"Deep scanline sampleCount data corrupt at tile " 
                                                << dx << ',' << dy << ',' << lx << ',' <<  ly 
                                                << ": pixel data only contains " << unpackedDataSize 
                                                << " bytes of data but table references at least " 
                                                << cumulative_total_samples*_data->combinedSampleSize << " bytes of sample data" );            
                }
                    
            }
        }

        _data->_streamData->is->seekg(savedFilePos);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading sample count data from image "
                     "file \"" << fileName() << "\". " << e.what());

         _data->_streamData->is->seekg(savedFilePos);

        throw;
    }
}